

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicssceneindex.cpp
# Opt level: O1

QList<QGraphicsItem_*> * __thiscall
QGraphicsSceneIndex::estimateTopLevelItems
          (QList<QGraphicsItem_*> *__return_storage_ptr__,QGraphicsSceneIndex *this,QRectF *rect,
          SortOrder order)

{
  QGraphicsScenePrivate *this_00;
  Data *pDVar1;
  QList<QGraphicsItem_*> *sorted;
  uint uVar2;
  long lVar3;
  long in_FS_OFFSET;
  QGraphicsItem *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsScenePrivate **)(*(long *)(*(long *)(this + 8) + 0x78) + 8);
  QGraphicsScenePrivate::ensureSortedTopLevelItems(this_00);
  if (order == DescendingOrder) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (QGraphicsItem **)0x0;
    (__return_storage_ptr__->d).size = 0;
    uVar2 = (uint)(this_00->topLevelItems).d.size;
    QList<QGraphicsItem_*>::reserve(__return_storage_ptr__,(long)(int)uVar2);
    if (0 < (int)uVar2) {
      lVar3 = (ulong)(uVar2 & 0x7fffffff) + 1;
      do {
        local_38 = (this_00->topLevelItems).d.ptr[lVar3 + -2];
        QtPrivate::QPodArrayOps<QGraphicsItem*>::emplace<QGraphicsItem*&>
                  ((QPodArrayOps<QGraphicsItem*> *)__return_storage_ptr__,
                   (__return_storage_ptr__->d).size,&local_38);
        QList<QGraphicsItem_*>::end(__return_storage_ptr__);
        lVar3 = lVar3 + -1;
      } while (1 < lVar3);
    }
  }
  else {
    pDVar1 = (this_00->topLevelItems).d.d;
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = (this_00->topLevelItems).d.ptr;
    (__return_storage_ptr__->d).size = (this_00->topLevelItems).d.size;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QList<QGraphicsItem *> QGraphicsSceneIndex::estimateTopLevelItems(const QRectF &rect, Qt::SortOrder order) const
{
    Q_D(const QGraphicsSceneIndex);
    Q_UNUSED(rect);
    QGraphicsScenePrivate *scened = d->scene->d_func();
    scened->ensureSortedTopLevelItems();
    if (order == Qt::DescendingOrder) {
        QList<QGraphicsItem *> sorted;
        const int numTopLevelItems = scened->topLevelItems.size();
        sorted.reserve(numTopLevelItems);
        for (int i = numTopLevelItems - 1; i >= 0; --i)
            sorted << scened->topLevelItems.at(i);
        return sorted;
    }
    return scened->topLevelItems;
}